

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UChar * ures_getStringWithAlias
                  (UResourceBundle *resB,Resource r,int32_t sIndex,int32_t *len,UErrorCode *status)

{
  UResourceBundle *resB_00;
  UResourceBundle *tempRes;
  UChar *result;
  UErrorCode *status_local;
  int32_t *len_local;
  int32_t sIndex_local;
  Resource r_local;
  UResourceBundle *resB_local;
  
  if (r >> 0x1c == 3) {
    resB_00 = ures_getByIndex_63(resB,sIndex,(UResourceBundle *)0x0,status);
    resB_local = (UResourceBundle *)ures_getString_63(resB_00,len,status);
    ures_close_63(resB_00);
  }
  else {
    resB_local = (UResourceBundle *)res_getString_63(&resB->fResData,r,len);
  }
  return (UChar *)resB_local;
}

Assistant:

static const UChar* ures_getStringWithAlias(const UResourceBundle *resB, Resource r, int32_t sIndex, int32_t *len, UErrorCode *status) {
  if(RES_GET_TYPE(r) == URES_ALIAS) {
    const UChar* result = 0;
    UResourceBundle *tempRes = ures_getByIndex(resB, sIndex, NULL, status);
    result = ures_getString(tempRes, len, status);
    ures_close(tempRes);
    return result;
  } else {
    return res_getString(&(resB->fResData), r, len); 
  }
}